

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void prvTidyResetConfigToSnapshot(TidyDocImpl *doc)

{
  Bool BVar1;
  uint *in_RCX;
  ulong uVar2;
  TidyOptionValue *current;
  TidyOptionImpl *option;
  uint changedUserTags;
  undefined4 local_2c;
  
  current = (doc->config).snapshot;
  BVar1 = NeedReparseTagDecls((TidyDocImpl *)&doc->config,current,
                              (TidyOptionValue *)&stack0xffffffffffffffd4,in_RCX);
  option = option_defs;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 0x68) {
      if (BVar1 != no) {
        ReparseTagDecls(doc,local_2c);
        return;
      }
      return;
    }
    if (uVar2 != option->id) break;
    CopyOptionValue(doc,option,current + -0x69,current);
    option = option + 1;
    uVar2 = uVar2 + 1;
    current = current + 1;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                ,0x2e1,"void prvTidyResetConfigToSnapshot(TidyDocImpl *)");
}

Assistant:

void TY_(ResetConfigToSnapshot)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    TidyOptionValue* value = &doc->config.value[ 0 ];
    const TidyOptionValue* snap  = &doc->config.snapshot[ 0 ];
    uint changedUserTags;
    Bool needReparseTagsDecls = NeedReparseTagDecls( doc, value, snap,
                                                     &changedUserTags );
    
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        CopyOptionValue( doc, option, &value[ixVal], &snap[ixVal] );
    }
    if ( needReparseTagsDecls )
        ReparseTagDecls( doc, changedUserTags );
}